

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.h
# Opt level: O1

bool SelectiveBranchingMT::run(Search::search&,std::vector<example*,std::allocator<example*>>&)::$_5
     ::__invoke(Search::search__unsigned_long_unsigned_int__float__
               (search *sch,size_t t,action *a,float *a_cost)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  
  lVar1 = *(long *)((long)sch->metatask_data + 0x10);
  lVar2 = *(long *)((long)sch->metatask_data + 0x78);
  lVar3 = *(long *)(lVar1 + 8 + lVar2 * 0x28);
  uVar4 = *(long *)(lVar1 + 0x10 + lVar2 * 0x28) - lVar3 >> 3;
  if (t < uVar4) {
    *a = *(action *)(lVar3 + t * 8);
    *a_cost = *(float *)(*(long *)(lVar1 + lVar2 * 0x28 + 8) + 4 + t * 8);
  }
  return t < uVar4;
}

Assistant:

T* get_metatask_data()
  {
    return (T*)metatask_data;
  }